

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O0

void __thiscall PoolResource<48UL,_8UL>::AllocateChunk(PoolResource<48UL,_8UL> *this)

{
  long lVar1;
  list<std::byte_*,_std::allocator<std::byte_*>_> *this_00;
  byte **__args;
  PoolResource<48UL,_8UL> *in_RDI;
  long in_FS_OFFSET;
  void *storage;
  size_t remaining_available_bytes;
  ListNode **in_stack_ffffffffffffffc8;
  byte *p;
  byte *in_stack_ffffffffffffffe0;
  byte *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (list<std::byte_*,_std::allocator<std::byte_*>_> *)
            std::distance<std::byte*>(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (this_00 != (list<std::byte_*,_std::allocator<std::byte_*>_> *)0x0) {
    p = in_RDI->m_available_memory_it;
    std::array<PoolResource<48UL,_8UL>::ListNode_*,_7UL>::operator[]
              ((array<PoolResource<48UL,_8UL>::ListNode_*,_7UL> *)in_RDI,(size_type)p);
    PlacementAddToList(in_RDI,p,in_stack_ffffffffffffffc8);
  }
  __args = (byte **)operator_new((ulong)in_RDI->m_chunk_size_bytes,8);
  in_RDI->m_available_memory_it = (byte *)__args;
  in_RDI->m_available_memory_end = in_RDI->m_available_memory_it + (long)in_RDI->m_chunk_size_bytes;
  std::__cxx11::list<std::byte*,std::allocator<std::byte*>>::emplace_back<std::byte*&>
            (this_00,__args);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AllocateChunk()
    {
        // if there is still any available memory left, put it into the freelist.
        size_t remaining_available_bytes = std::distance(m_available_memory_it, m_available_memory_end);
        if (0 != remaining_available_bytes) {
            PlacementAddToList(m_available_memory_it, m_free_lists[remaining_available_bytes / ELEM_ALIGN_BYTES]);
        }

        void* storage = ::operator new (m_chunk_size_bytes, std::align_val_t{ELEM_ALIGN_BYTES});
        m_available_memory_it = new (storage) std::byte[m_chunk_size_bytes];
        m_available_memory_end = m_available_memory_it + m_chunk_size_bytes;
        m_allocated_chunks.emplace_back(m_available_memory_it);
    }